

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcabs1.c
# Opt level: O2

doublereal dcabs1_(doublecomplex *z)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  
  dVar3 = z->r;
  dVar4 = z->i;
  uVar5 = -(ulong)(-dVar3 <= dVar3);
  uVar6 = -(ulong)(-dVar4 <= dVar4);
  uVar2 = (ulong)dVar4 & uVar6;
  auVar7._0_8_ = ~uVar5 & (ulong)-dVar3;
  auVar7._8_8_ = ~uVar6 & (ulong)-dVar4;
  auVar1._8_4_ = (int)uVar2;
  auVar1._0_8_ = (ulong)dVar3 & uVar5;
  auVar1._12_4_ = (int)(uVar2 >> 0x20);
  return SUB168(auVar7 | auVar1,8) + SUB168(auVar7 | auVar1,0);
}

Assistant:

doublereal dcabs1_(doublecomplex *z)
{
/* >>Start of File<<   

       System generated locals */
    doublereal ret_val;
    doublecomplex equiv_0[1];

    /* Local variables */
#define t ((doublereal *)equiv_0)
#define zz (equiv_0)

    zz->r = z->r, zz->i = z->i;
    ret_val = abs(t[0]) + abs(t[1]);
    return ret_val;
}